

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void cs_impl::hash_map_cs_ext::insert(hash_map *map,var *key,var *val)

{
  size_t sVar1;
  MappedReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> this;
  any *this_00;
  any aStack_58;
  any local_50;
  any local_48;
  any local_40;
  any local_38;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_30;
  
  sVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
          ::count<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                      *)map,key);
  if (sVar1 == 0) {
    local_40.mDat = key->mDat;
    if (local_40.mDat != (proxy *)0x0) {
      (local_40.mDat)->refcount = (local_40.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&local_50,(EVP_PKEY_CTX *)&local_40);
    local_48.mDat = val->mDat;
    if (local_48.mDat != (proxy *)0x0) {
      (local_48.mDat)->refcount = (local_48.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&aStack_58,(EVP_PKEY_CTX *)&local_48);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
    ::emplace<cs_impl::any,_cs_impl::any,_0>
              (&local_30,
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                *)map,&local_50,&aStack_58);
    any::recycle(&aStack_58);
    any::recycle(&local_48);
    any::recycle(&local_50);
    this_00 = &local_40;
  }
  else {
    this = phmap::priv::
           raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
           ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                     ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                       *)map,key);
    local_38.mDat = val->mDat;
    if (local_38.mDat != (proxy *)0x0) {
      (local_38.mDat)->refcount = (local_38.mDat)->refcount + 1;
    }
    cs::copy((EVP_PKEY_CTX *)&local_30,(EVP_PKEY_CTX *)&local_38);
    any::swap(this,(any *)&local_30,true);
    any::recycle((any *)&local_30);
    this_00 = &local_38;
  }
  any::recycle(this_00);
  return;
}

Assistant:

void insert(hash_map &map, const var &key, const var &val)
		{
			if (map.count(key) > 0)
				map.at(key).swap(copy(val), true);
			else
				map.emplace(copy(key), copy(val));
		}